

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_scanner.cpp
# Opt level: O0

void __thiscall
duckdb::CSVFileScan::SetNamesAndTypes
          (CSVFileScan *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names_p,vector<duckdb::LogicalType,_true> *types_p)

{
  vector<duckdb::LogicalType,_true> *in_RDI;
  vector<duckdb::LogicalType,_true> *in_stack_000000b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_000000b8;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffd0;
  
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_stack_ffffffffffffffd0,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_RDI);
  vector<duckdb::LogicalType,_true>::operator=(in_stack_ffffffffffffffd0,in_RDI);
  MultiFileColumnDefinition::ColumnsFromNamesAndTypes(in_stack_000000b8,in_stack_000000b0);
  vector<duckdb::MultiFileColumnDefinition,_true>::operator=
            ((vector<duckdb::MultiFileColumnDefinition,_true> *)in_stack_ffffffffffffffd0,
             (vector<duckdb::MultiFileColumnDefinition,_true> *)in_RDI);
  vector<duckdb::MultiFileColumnDefinition,_true>::~vector
            ((vector<duckdb::MultiFileColumnDefinition,_true> *)0x17b054d);
  return;
}

Assistant:

void CSVFileScan::SetNamesAndTypes(const vector<string> &names_p, const vector<LogicalType> &types_p) {
	names = names_p;
	types = types_p;
	columns = MultiFileColumnDefinition::ColumnsFromNamesAndTypes(names, types);
}